

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isgraph.c
# Opt level: O3

int main(void)

{
  ushort **ppuVar1;
  ushort *puVar2;
  
  ppuVar1 = __ctype_b_loc();
  puVar2 = *ppuVar1;
  if (-1 < (short)puVar2[0x61]) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1a,"isgraph( \'a\' )");
    puVar2 = *ppuVar1;
  }
  if (-1 < (short)puVar2[0x7a]) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1b,"isgraph( \'z\' )");
    puVar2 = *ppuVar1;
  }
  if (-1 < (short)puVar2[0x41]) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1c,"isgraph( \'A\' )");
    puVar2 = *ppuVar1;
  }
  if (-1 < (short)puVar2[0x5a]) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1d,"isgraph( \'Z\' )");
    puVar2 = *ppuVar1;
  }
  if (-1 < (short)puVar2[0x40]) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1e,"isgraph( \'@\' )");
    puVar2 = *ppuVar1;
  }
  if ((short)puVar2[9] < 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x1f,"! isgraph( \'\\t\' )");
    puVar2 = *ppuVar1;
  }
  if ((short)*puVar2 < 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x20,"! isgraph( \'\\0\' )");
    puVar2 = *ppuVar1;
  }
  if ((short)puVar2[0x20] < 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/ctype/isgraph.c, line %d - %s\n"
           ,0x21,"! isgraph( \' \' )");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    TESTCASE( isgraph( 'a' ) );
    TESTCASE( isgraph( 'z' ) );
    TESTCASE( isgraph( 'A' ) );
    TESTCASE( isgraph( 'Z' ) );
    TESTCASE( isgraph( '@' ) );
    TESTCASE( ! isgraph( '\t' ) );
    TESTCASE( ! isgraph( '\0' ) );
    TESTCASE( ! isgraph( ' ' ) );
    return TEST_RESULTS;
}